

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uecc.c
# Opt level: O0

int secp256r1_create_key_exchange(ptls_key_exchange_context_t **_ctx,ptls_iovec_t *pubkey)

{
  ptls_key_exchange_context_t *ppVar1;
  uECC_Curve curve;
  ptls_iovec_t pVar2;
  uint8_t *local_40;
  size_t local_38;
  st_secp256r1_key_exhchange_t *ctx;
  ptls_iovec_t *pubkey_local;
  ptls_key_exchange_context_t **_ctx_local;
  
  ppVar1 = (ptls_key_exchange_context_t *)malloc(0x70);
  if (ppVar1 == (ptls_key_exchange_context_t *)0x0) {
    _ctx_local._4_4_ = 0x201;
  }
  else {
    ppVar1->on_exchange = secp256r1_on_exchange;
    *(undefined1 *)&ppVar1[5].on_exchange = 4;
    curve = uECC_secp256r1();
    uECC_make_key((uint8_t *)((long)&ppVar1[5].on_exchange + 1),(uint8_t *)(ppVar1 + 1),curve);
    *_ctx = ppVar1;
    pVar2 = ptls_iovec_init(ppVar1 + 5,0x41);
    local_40 = pVar2.base;
    pubkey->base = local_40;
    local_38 = pVar2.len;
    pubkey->len = local_38;
    _ctx_local._4_4_ = 0;
  }
  return _ctx_local._4_4_;
}

Assistant:

static int secp256r1_create_key_exchange(ptls_key_exchange_context_t **_ctx, ptls_iovec_t *pubkey)
{
    struct st_secp256r1_key_exhchange_t *ctx;

    if ((ctx = (struct st_secp256r1_key_exhchange_t *)malloc(sizeof(*ctx))) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    ctx->super = (ptls_key_exchange_context_t){secp256r1_on_exchange};
    ctx->pub[0] = TYPE_UNCOMPRESSED_PUBLIC_KEY;
    uECC_make_key(ctx->pub + 1, ctx->priv, uECC_secp256r1());

    *_ctx = &ctx->super;
    *pubkey = ptls_iovec_init(ctx->pub, sizeof(ctx->pub));
    return 0;
}